

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmCallm<(moira::Instr)142,(moira::Mode)10,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  u32 uVar2;
  StrWriter *pSVar3;
  Av<(moira::Instr)142,_(moira::Mode)10,_4> local_5c [2];
  Imu<4> local_54;
  int local_50;
  Ims<1> local_48;
  int local_44;
  undefined1 local_3c [8];
  Ea<(moira::Mode)10,_4> dst;
  u32 src;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  dst.ext3._2_2_ = op;
  uVar2 = dasmIncRead<2>(this,addr);
  dst.ext2 = uVar2 & 0xff;
  Op<(moira::Mode)10,4>((Ea<(moira::Mode)10,_4> *)local_3c,this,dst.ext3._2_2_ & 7,addr);
  SVar1 = str->style->syntax;
  if (SVar1 == GNU || SVar1 == GNU_MIT) {
    pSVar3 = StrWriter::operator<<(str);
    local_44 = (str->tab).raw;
    pSVar3 = StrWriter::operator<<(pSVar3,(Tab)local_44);
    Ims<1>::Ims(&local_48,dst.ext2);
    pSVar3 = StrWriter::operator<<(pSVar3,local_48);
    pSVar3 = StrWriter::operator<<(pSVar3);
    StrWriter::operator<<(pSVar3,(Ea<(moira::Mode)10,_4> *)local_3c);
  }
  else {
    pSVar3 = StrWriter::operator<<(str);
    local_50 = (str->tab).raw;
    pSVar3 = StrWriter::operator<<(pSVar3,(Tab)local_50);
    Imu<4>::Imu(&local_54,dst.ext2);
    pSVar3 = StrWriter::operator<<(pSVar3,local_54);
    pSVar3 = StrWriter::operator<<(pSVar3);
    pSVar3 = StrWriter::operator<<(pSVar3,(Ea<(moira::Mode)10,_4> *)local_3c);
    local_5c[0].ext1 = 0;
    StrWriter::operator<<(pSVar3,local_5c);
  }
  return;
}

Assistant:

void
Moira::dasmCallm(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead(addr) & 0xFF;
    auto dst = Op<M, S>( _____________xxx(op), addr );

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << str.tab << Ims<Byte>(src) << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << str.tab << Imu(src) << Sep{} << dst << Av<I, M, S>{};
    }
}